

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall ChainstateManager::LoadBlockIndex(ChainstateManager *this)

{
  BlockManager *this_00;
  CBlockIndex *pb;
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  CBlockIndex *pCVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vSortedByHeight;
  undefined8 *local_78;
  undefined8 *local_70;
  _Storage<uint256,_true> local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if (((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0) {
    this_00 = &this->m_blockman;
    SnapshotBlockhash((optional<uint256> *)&local_60._M_value,this);
    bVar2 = ::node::BlockManager::LoadBlockIndexDB(this_00,(optional<uint256> *)&local_60._M_value);
    if (bVar2) {
      ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
      ::node::BlockManager::GetAllBlockIndices
                ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)&local_60._M_value,this_00
                );
      std::
      __sort<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
                (local_60._0_8_,local_60._8_8_);
      for (uVar6 = local_60._0_8_; uVar6 != local_60._8_8_; uVar6 = uVar6 + 8) {
        pb = *(CBlockIndex **)uVar6;
        bVar2 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
        if (bVar2) {
          std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base
                    ((_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
                     &local_60._M_value);
          goto LAB_008bbd87;
        }
        pCVar4 = GetSnapshotBaseBlock(this);
        if (pb == pCVar4) {
LAB_008bbcc0:
          GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_78,this);
          puVar1 = local_70;
          for (puVar5 = local_78; puVar5 != puVar1; puVar5 = puVar5 + 1) {
            Chainstate::TryAddBlockIndexCandidate((Chainstate *)*puVar5,pb);
          }
          std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                    ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_78);
          uVar3 = pb->nStatus & 0x60;
LAB_008bbd01:
          if ((uVar3 != 0) &&
             ((this->m_best_invalid == (CBlockIndex *)0x0 ||
              (bVar2 = operator>(&(pb->nChainWork).super_base_uint<256U>,
                                 &(this->m_best_invalid->nChainWork).super_base_uint<256U>), bVar2))
             )) {
            this->m_best_invalid = pb;
          }
        }
        else {
          uVar3 = pb->nStatus & 0x60;
          if ((pb->nStatus & 7) < 3 || uVar3 != 0) goto LAB_008bbd01;
          if ((pb->m_chain_tx_count != 0) || (pb->pprev == (CBlockIndex *)0x0)) goto LAB_008bbcc0;
        }
        if (((pb->nStatus & 6) != 0 && (pb->nStatus & 0x60) == 0) &&
           ((this->m_best_header == (CBlockIndex *)0x0 ||
            (bVar2 = ::node::CBlockIndexWorkComparator::operator()
                               ((CBlockIndexWorkComparator *)&local_78,this->m_best_header,pb),
            bVar2)))) {
          this->m_best_header = pb;
        }
      }
      std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base
                ((_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)&local_60._M_value);
      bVar2 = true;
    }
    else {
LAB_008bbd87:
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ChainstateManager::LoadBlockIndex()
{
    AssertLockHeld(cs_main);
    // Load block index from databases
    if (m_blockman.m_blockfiles_indexed) {
        bool ret{m_blockman.LoadBlockIndexDB(SnapshotBlockhash())};
        if (!ret) return false;

        m_blockman.ScanAndUnlinkAlreadyPrunedFiles();

        std::vector<CBlockIndex*> vSortedByHeight{m_blockman.GetAllBlockIndices()};
        std::sort(vSortedByHeight.begin(), vSortedByHeight.end(),
                  CBlockIndexHeightOnlyComparator());

        for (CBlockIndex* pindex : vSortedByHeight) {
            if (m_interrupt) return false;
            // If we have an assumeutxo-based chainstate, then the snapshot
            // block will be a candidate for the tip, but it may not be
            // VALID_TRANSACTIONS (eg if we haven't yet downloaded the block),
            // so we special-case the snapshot block as a potential candidate
            // here.
            if (pindex == GetSnapshotBaseBlock() ||
                    (pindex->IsValid(BLOCK_VALID_TRANSACTIONS) &&
                     (pindex->HaveNumChainTxs() || pindex->pprev == nullptr))) {

                for (Chainstate* chainstate : GetAll()) {
                    chainstate->TryAddBlockIndexCandidate(pindex);
                }
            }
            if (pindex->nStatus & BLOCK_FAILED_MASK && (!m_best_invalid || pindex->nChainWork > m_best_invalid->nChainWork)) {
                m_best_invalid = pindex;
            }
            if (pindex->IsValid(BLOCK_VALID_TREE) && (m_best_header == nullptr || CBlockIndexWorkComparator()(m_best_header, pindex)))
                m_best_header = pindex;
        }
    }
    return true;
}